

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunPool.h
# Opt level: O2

void __thiscall RunPool<int>::Add(RunPool<int> *this,int *value)

{
  int *piVar1;
  RunBlock<int> *pRVar2;
  RunBlock<int> *pRVar3;
  uint uVar4;
  
  pRVar3 = next_free_;
  pRVar2 = this->end_back_;
  uVar4 = pRVar2->next_free_pos_;
  if ((ulong)uVar4 < 800) {
    pRVar2->values[uVar4] = *value;
    pRVar3 = pRVar2;
  }
  else {
    piVar1 = next_free_->values;
    next_free_ = next_free_ + 1;
    *piVar1 = *value;
    pRVar3->prev = pRVar2;
    pRVar2->next = pRVar3;
    this->end_back_ = pRVar3;
    this->end_block_ = pRVar3;
    this->size_ = this->size_ + 800;
    uVar4 = pRVar3->next_free_pos_;
  }
  pRVar3->next_free_pos_ = uVar4 + 1;
  return;
}

Assistant:

void Add(ValueType &value) {
        if(end_back_->next_free_pos_ < kValuesPerBlock) {
            end_back_->values[end_back_->next_free_pos_] = value;
        } else {
            RunBlock<ValueType>* temp = Alloc();
            temp->values[0] = value;
            temp->prev = end_back_;
            end_back_->next = temp;
            end_back_ = temp;
            end_block_ = temp;
            size_ += kValuesPerBlock;
        }
        end_back_->next_free_pos_++;
    }